

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenArrayGet(BinaryenModuleRef module,BinaryenExpressionRef ref,BinaryenExpressionRef index,
                BinaryenType type,bool signed_)

{
  ArrayGet *pAVar1;
  Builder local_10;
  
  local_10.wasm = module;
  pAVar1 = wasm::Builder::makeArrayGet(&local_10,ref,index,(Type)type,signed_);
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenArrayGet(BinaryenModuleRef module,
                                       BinaryenExpressionRef ref,
                                       BinaryenExpressionRef index,
                                       BinaryenType type,
                                       bool signed_) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeArrayGet((Expression*)ref, (Expression*)index, Type(type), signed_));
}